

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

QWidget * __thiscall
QStyledItemDelegate::createEditor
          (QStyledItemDelegate *this,QWidget *parent,QStyleOptionViewItem *option,QModelIndex *index
          )

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QItemEditorFactory *pQVar4;
  undefined4 extraout_var;
  undefined8 in_RCX;
  QModelIndex *in_RDX;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QStyledItemDelegatePrivate *d;
  QStyledItemDelegatePrivate *in_stack_ffffffffffffffa0;
  QWidget *local_30;
  QVariant local_28;
  long local_8;
  
  iVar3 = (int)((ulong)in_RCX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QStyledItemDelegate *)0x85fba4);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    pQVar4 = QStyledItemDelegatePrivate::editorFactory(in_stack_ffffffffffffffa0);
    QModelIndex::data(in_RDX,iVar3);
    uVar2 = ::QVariant::userType((QVariant *)0x85fbef);
    iVar3 = (*pQVar4->_vptr_QItemEditorFactory[2])(pQVar4,(ulong)uVar2,in_RSI);
    local_30 = (QWidget *)CONCAT44(extraout_var,iVar3);
    ::QVariant::~QVariant(&local_28);
  }
  else {
    local_30 = (QWidget *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QStyledItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &option,
                                     const QModelIndex &index) const
{
    Q_UNUSED(option);
    Q_D(const QStyledItemDelegate);
    if (!index.isValid())
        return nullptr;
    return d->editorFactory()->createEditor(index.data(Qt::EditRole).userType(), parent);
}